

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

bool waitForPopup(QToolBar *tb,QWidget *popup)

{
  bool bVar1;
  QWidget *pQVar2;
  QMenu *this;
  iterator iVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QObject_*> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((popup != (QWidget *)0x0) && (pQVar2 = popup, (popup->data->widget_attributes & 0x10000) == 0)
     ) {
    for (; pQVar2 != (QWidget *)0x0; pQVar2 = *(QWidget **)(*(long *)&pQVar2->field_0x8 + 0x10)) {
      if (pQVar2 == &tb->super_QWidget) goto LAB_0046d2ae;
    }
    this = QtPrivate::qobject_cast_helper<QMenu*,QObject>(&popup->super_QObject);
    if (this != (QMenu *)0x0) {
      QMenu::menuAction(this);
      QAction::associatedObjects();
      iVar3 = QList<QObject_*>::begin((QList<QObject_*> *)&QStack_38);
      iVar4 = QList<QObject_*>::end((QList<QObject_*> *)&QStack_38);
      for (; iVar3.i != iVar4.i; iVar3.i = iVar3.i + 1) {
        pQVar2 = (QWidget *)*iVar3.i;
        if (((pQVar2 != (QWidget *)0x0) &&
            ((*(byte *)(*(long *)&pQVar2->field_0x8 + 0x30) & 1) != 0)) &&
           (bVar1 = waitForPopup(tb,pQVar2), bVar1)) {
          QArrayDataPointer<QObject_*>::~QArrayDataPointer(&QStack_38);
LAB_0046d2ae:
          bVar1 = true;
          goto LAB_0046d28c;
        }
      }
      QArrayDataPointer<QObject_*>::~QArrayDataPointer(&QStack_38);
    }
  }
  bVar1 = false;
LAB_0046d28c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool waitForPopup(QToolBar *tb, QWidget *popup)
{
    if (popup == nullptr || popup->isHidden())
        return false;

    QWidget *w = popup;
    while (w != nullptr) {
        if (w == tb)
            return true;
        w = w->parentWidget();
    }

    QMenu *menu = qobject_cast<QMenu*>(popup);
    if (menu == nullptr)
        return false;

    const QAction *action = menu->menuAction();
    for (auto object : action->associatedObjects()) {
        if (QWidget *widget = qobject_cast<QWidget*>(object)) {
            if (waitForPopup(tb, widget))
                return true;
        }
    }

    return false;
}